

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

Pattern * slang::ast::TaggedPattern::fromSyntax
                    (TaggedPatternSyntax *syntax,Type *targetType,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  Compilation *comp_00;
  Type *pTVar3;
  undefined4 extraout_var;
  Compilation *child;
  SourceRange *in_RDX;
  long in_RDI;
  string_view name;
  SourceRange SVar4;
  TaggedPattern *result;
  Compilation *comp;
  Pattern *value;
  FieldSymbol *field;
  Symbol *member;
  string_view memberName;
  Type *in_stack_ffffffffffffff70;
  SourceRange *in_stack_ffffffffffffff78;
  Token *in_stack_ffffffffffffff80;
  Pattern *local_58;
  SyntaxNode *this;
  Scope *in_stack_ffffffffffffffc8;
  TaggedPattern *local_8;
  
  name = parsing::Token::valueText(in_stack_ffffffffffffff80);
  Type::getCanonicalType(in_stack_ffffffffffffff70);
  Symbol::as<slang::ast::Scope>((Symbol *)0x6ab68e);
  this = (SyntaxNode *)name._M_str;
  Scope::find(in_stack_ffffffffffffffc8,name);
  comp_00 = (Compilation *)Symbol::as<slang::ast::FieldSymbol>((Symbol *)0x6ab6c5);
  local_58 = (Pattern *)0x0;
  if (*(long *)(in_RDI + 0x38) != 0) {
    in_stack_ffffffffffffff80 = *(Token **)(in_RDI + 0x38);
    pTVar3 = ValueSymbol::getType((ValueSymbol *)0x6ab707);
    iVar2 = Pattern::bind((int)in_RDX,(sockaddr *)in_stack_ffffffffffffff80,(socklen_t)pTVar3);
    local_58 = (Pattern *)CONCAT44(extraout_var,iVar2);
    in_stack_ffffffffffffff78 = in_RDX;
  }
  child = ASTContext::getCompilation((ASTContext *)0x6ab728);
  SVar4 = slang::syntax::SyntaxNode::sourceRange(this);
  local_8 = BumpAllocator::
            emplace<slang::ast::TaggedPattern,slang::ast::FieldSymbol_const&,slang::ast::Pattern_const*&,slang::SourceRange>
                      ((BumpAllocator *)SVar4.endLoc,(FieldSymbol *)SVar4.startLoc,
                       (Pattern **)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if ((local_58 != (Pattern *)0x0) && (bVar1 = Pattern::bad(local_58), bVar1)) {
    local_8 = (TaggedPattern *)Pattern::badPattern(comp_00,(Pattern *)child);
  }
  return &local_8->super_Pattern;
}

Assistant:

Pattern& TaggedPattern::fromSyntax(const TaggedPatternSyntax& syntax, const Type& targetType,
                                   const ASTContext& context) {
    SLANG_ASSERT(targetType.isTaggedUnion());

    auto memberName = syntax.memberName.valueText();
    auto member = targetType.getCanonicalType().as<Scope>().find(memberName);
    SLANG_ASSERT(member);

    auto& field = member->as<FieldSymbol>();

    const Pattern* value = nullptr;
    if (syntax.pattern)
        value = &Pattern::bind(context, *syntax.pattern, field.getType());

    auto& comp = context.getCompilation();
    auto result = comp.emplace<TaggedPattern>(field, value, syntax.sourceRange());
    if (value && value->bad())
        return badPattern(comp, result);

    return *result;
}